

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceObjectArchive::
LoadResourceCommonData<Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>>
          (DeviceObjectArchive *this,ResourceType Type,char *Name,
          PSOData<Diligent::RayTracingPipelineStateCreateInfo> *ResData)

{
  bool bVar1;
  const_iterator cVar2;
  char (*Args_1) [40];
  char (*Args_1_00) [14];
  char (*in_R8) [32];
  string _msg;
  char *local_40;
  Serializer<(Diligent::SerializerMode)0> Ser;
  
  Args_1 = (char (*) [40])0x0;
  local_40 = Name;
  NamedResourceKey::NamedResourceKey((NamedResourceKey *)&_msg,Type,Name,false);
  cVar2 = std::
          _Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<Diligent::DeviceObjectArchive::NamedResourceKey,_std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,(key_type *)&_msg);
  HashMapStringKey::Clear((HashMapStringKey *)&_msg._M_string_length);
  if (cVar2.
      super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
      ._M_cur == (__node_type *)0x0) {
    FormatString<char[11],char_const*,char[32]>
              (&_msg,(Diligent *)"Resource \'",(char (*) [11])&local_40,
               (char **)"\' is not present in the archive",in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
    bVar1 = false;
  }
  else {
    bVar1 = SafeStrEqual(Name,*(char **)((long)cVar2.
                                               super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                               ._M_cur + 0x10));
    if (!bVar1) {
      FormatString<char[26],char[40]>
                (&_msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x106);
      std::__cxx11::string::~string((string *)&_msg);
    }
    Ser.m_Start = *(TPointer *)
                   ((long)cVar2.
                          super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                          ._M_cur + 0x28);
    Args_1_00 = (char (*) [14])
                (Ser.m_Start +
                *(long *)((long)cVar2.
                                super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                ._M_cur + 0x30));
    Ser.m_End = (TPointer)Args_1_00;
    Ser.m_Ptr = Ser.m_Start;
    bVar1 = DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::Deserialize
                      (ResData,*(char **)((long)cVar2.
                                                super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                                ._M_cur + 0x10),&Ser);
    if (Ser.m_Ptr != Ser.m_End) {
      FormatString<char[26],char[14]>
                (&_msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65cec2,Args_1_00);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"LoadResourceCommonData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceObjectArchive.hpp"
                 ,0x10d);
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  return bVar1;
}

Assistant:

bool LoadResourceCommonData(ResourceType     Type,
                                const char*      Name,
                                ReourceDataType& ResData) const
    {
        auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
        if (it == m_NamedResources.end())
        {
            LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
            return false;
        }
        VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
        // Use string copy from the map
        Name = it->first.GetName();

        Serializer<SerializerMode::Read> Ser{it->second.Common};

        auto Res = ResData.Deserialize(Name, Ser);
        VERIFY_EXPR(Ser.IsEnded());
        return Res;
    }